

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O3

unique_ptr<S2Loop,_std::default_delete<S2Loop>_>
s2textformat::MakeLoopOrDie(string_view str,S2Debug debug_override)

{
  bool bVar1;
  ostream *poVar2;
  unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *in_RCX;
  size_type sVar3;
  undefined7 in_register_00000011;
  __uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true> _Var4;
  S2Debug in_R8B;
  string_view str_00;
  string_view piece;
  S2LogMessage SStack_28;
  
  piece.ptr_ = (char *)CONCAT71(in_register_00000011,debug_override);
  _Var4.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
  super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
  super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
       (__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>)str.ptr_;
  *(undefined8 *)
   _Var4.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
   super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
   super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl = 0;
  str_00.length_ =
       (size_type)
       _Var4.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
       super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
       super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl;
  str_00.ptr_ = piece.ptr_;
  bVar1 = MakeLoop((s2textformat *)str.length_,str_00,in_RCX,in_R8B);
  if (bVar1) {
    return (__uniq_ptr_data<S2Loop,_std::default_delete<S2Loop>,_true,_true>)
           (tuple<S2Loop_*,_std::default_delete<S2Loop>_>)
           _Var4.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t.
           super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
           super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl;
  }
  sVar3 = 3;
  S2LogMessage::S2LogMessage
            (&SStack_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
             ,0xa6,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_28.stream_,"Check failed: MakeLoop(str, &loop, debug_override) ",0x33);
  std::__ostream_insert<char,std::char_traits<char>>(SStack_28.stream_,": str == \"",10);
  piece.length_ = sVar3;
  poVar2 = absl::operator<<((absl *)SStack_28.stream_,(ostream *)str.length_,piece);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  abort();
}

Assistant:

unique_ptr<S2Loop> MakeLoopOrDie(string_view str, S2Debug debug_override) {
  unique_ptr<S2Loop> loop;
  S2_CHECK(MakeLoop(str, &loop, debug_override)) << ": str == \"" << str << "\"";
  return loop;
}